

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O3

void embree::avx512::
     BVHNIntersector1<8,_16777232,_false,_embree::avx512::ArrayIntersector1<embree::avx512::InstanceArrayIntersector1MB>_>
     ::intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  float *pfVar1;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar2;
  bool bVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [32];
  ulong uVar6;
  byte bVar7;
  byte bVar8;
  AABBNodeMB4D *node1;
  undefined1 (*pauVar9) [32];
  long lVar10;
  byte bVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  Primitive *prim;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  float fVar29;
  float fVar30;
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [32];
  undefined4 uVar34;
  undefined8 uVar35;
  undefined1 auVar36 [32];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  Precalculations pre;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  Precalculations local_2481;
  RayHit *local_2480;
  RayQueryContext *local_2478;
  ulong local_2470;
  ulong *local_2468;
  long local_2460;
  undefined1 local_2458 [32];
  undefined1 local_2438 [32];
  undefined1 local_2418 [32];
  undefined1 local_23f8 [32];
  undefined1 local_23d8 [32];
  undefined1 local_23b8 [32];
  undefined1 local_2398 [32];
  ulong local_2378;
  undefined4 local_2370 [2];
  ulong local_2368 [1127];
  
  local_2378 = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_2378 != 8) {
    local_2468 = local_2368;
    aVar2 = (ray->super_RayK<1>).dir.field_0.field_1;
    auVar4 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]));
    fVar29 = (ray->super_RayK<1>).tfar;
    auVar32 = ZEXT464((uint)fVar29);
    auVar18._8_4_ = 0x7fffffff;
    auVar18._0_8_ = 0x7fffffff7fffffff;
    auVar18._12_4_ = 0x7fffffff;
    auVar18 = vandps_avx512vl((undefined1  [16])aVar2,auVar18);
    auVar20._8_4_ = 0x219392ef;
    auVar20._0_8_ = 0x219392ef219392ef;
    auVar20._12_4_ = 0x219392ef;
    local_2370[0] = 0;
    uVar13 = vcmpps_avx512vl(auVar18,auVar20,1);
    bVar3 = (bool)((byte)uVar13 & 1);
    auVar19._0_4_ = (uint)bVar3 * 0x219392ef | (uint)!bVar3 * (int)aVar2.x;
    bVar3 = (bool)((byte)(uVar13 >> 1) & 1);
    auVar19._4_4_ = (uint)bVar3 * 0x219392ef | (uint)!bVar3 * (int)aVar2.y;
    bVar3 = (bool)((byte)(uVar13 >> 2) & 1);
    auVar19._8_4_ = (uint)bVar3 * 0x219392ef | (uint)!bVar3 * (int)aVar2.z;
    bVar3 = (bool)((byte)(uVar13 >> 3) & 1);
    auVar19._12_4_ = (uint)bVar3 * 0x219392ef | (uint)!bVar3 * aVar2.field_3.a;
    auVar20 = vrcp14ps_avx512vl(auVar19);
    auVar21._8_4_ = 0x3f800000;
    auVar21._0_8_ = 0x3f8000003f800000;
    auVar21._12_4_ = 0x3f800000;
    auVar21 = vfnmadd213ps_avx512vl(auVar19,auVar20,auVar21);
    auVar18 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)fVar29));
    auVar20 = vfmadd132ps_fma(auVar21,auVar20,auVar20);
    fVar29 = auVar20._0_4_;
    local_2398._4_4_ = fVar29;
    local_2398._0_4_ = fVar29;
    local_2398._8_4_ = fVar29;
    local_2398._12_4_ = fVar29;
    local_2398._16_4_ = fVar29;
    local_2398._20_4_ = fVar29;
    local_2398._24_4_ = fVar29;
    local_2398._28_4_ = fVar29;
    auVar37 = ZEXT3264(local_2398);
    auVar21 = vmovshdup_avx(auVar20);
    uVar35 = auVar21._0_8_;
    local_23b8._8_8_ = uVar35;
    local_23b8._0_8_ = uVar35;
    local_23b8._16_8_ = uVar35;
    local_23b8._24_8_ = uVar35;
    auVar38 = ZEXT3264(local_23b8);
    auVar19 = vshufpd_avx(auVar20,auVar20,1);
    auVar24._8_4_ = 2;
    auVar24._0_8_ = 0x200000002;
    auVar24._12_4_ = 2;
    auVar24._16_4_ = 2;
    auVar24._20_4_ = 2;
    auVar24._24_4_ = 2;
    auVar24._28_4_ = 2;
    local_23d8 = vpermps_avx2(auVar24,ZEXT1632(auVar20));
    auVar39 = ZEXT3264(local_23d8);
    fVar30 = fVar29 * (ray->super_RayK<1>).org.field_0.m128[0];
    auVar22._8_4_ = 1;
    auVar22._0_8_ = 0x100000001;
    auVar22._12_4_ = 1;
    auVar22._16_4_ = 1;
    auVar22._20_4_ = 1;
    auVar22._24_4_ = 1;
    auVar22._28_4_ = 1;
    auVar23 = ZEXT1632(CONCAT412(auVar20._12_4_ * (ray->super_RayK<1>).org.field_0.m128[3],
                                 CONCAT48(auVar20._8_4_ * (ray->super_RayK<1>).org.field_0.m128[2],
                                          CONCAT44(auVar20._4_4_ *
                                                   (ray->super_RayK<1>).org.field_0.m128[1],fVar30))
                                ));
    auVar22 = vpermps_avx2(auVar22,auVar23);
    auVar23 = vpermps_avx2(auVar24,auVar23);
    uVar13 = (ulong)(fVar29 < 0.0) << 5;
    uVar16 = (ulong)(auVar21._0_4_ < 0.0) << 5 | 0x40;
    uVar15 = (ulong)(auVar19._0_4_ < 0.0) << 5 | 0x80;
    uVar12 = uVar13 ^ 0x20;
    uVar34 = auVar4._0_4_;
    local_23f8._4_4_ = uVar34;
    local_23f8._0_4_ = uVar34;
    local_23f8._8_4_ = uVar34;
    local_23f8._12_4_ = uVar34;
    local_23f8._16_4_ = uVar34;
    local_23f8._20_4_ = uVar34;
    local_23f8._24_4_ = uVar34;
    local_23f8._28_4_ = uVar34;
    auVar40 = ZEXT3264(local_23f8);
    auVar33._8_4_ = 0x80000000;
    auVar33._0_8_ = 0x8000000080000000;
    auVar33._12_4_ = 0x80000000;
    auVar33._16_4_ = 0x80000000;
    auVar33._20_4_ = 0x80000000;
    auVar33._24_4_ = 0x80000000;
    auVar33._28_4_ = 0x80000000;
    uVar34 = auVar18._0_4_;
    auVar31 = ZEXT3264(CONCAT428(uVar34,CONCAT424(uVar34,CONCAT420(uVar34,CONCAT416(uVar34,CONCAT412
                                                  (uVar34,CONCAT48(uVar34,CONCAT44(uVar34,uVar34))))
                                                  ))));
    local_2418._0_8_ = CONCAT44(fVar30,fVar30) ^ 0x8000000080000000;
    local_2418._8_4_ = -fVar30;
    local_2418._12_4_ = -fVar30;
    local_2418._16_4_ = -fVar30;
    local_2418._20_4_ = -fVar30;
    local_2418._24_4_ = -fVar30;
    local_2418._28_4_ = -fVar30;
    auVar41 = ZEXT3264(local_2418);
    local_2438._0_8_ = auVar22._0_8_ ^ 0x8000000080000000;
    local_2438._8_4_ = auVar22._8_4_ ^ 0x80000000;
    local_2438._12_4_ = auVar22._12_4_ ^ 0x80000000;
    local_2438._16_4_ = auVar22._16_4_ ^ 0x80000000;
    local_2438._20_4_ = auVar22._20_4_ ^ 0x80000000;
    local_2438._24_4_ = auVar22._24_4_ ^ 0x80000000;
    local_2438._28_4_ = auVar22._28_4_ ^ 0x80000000;
    auVar42 = ZEXT3264(local_2438);
    local_2458 = vxorps_avx512vl(auVar23,auVar33);
    auVar43 = ZEXT3264(local_2458);
    auVar22 = vpmovsxbd_avx512vl(ZEXT816(0x706050403020100));
    auVar44 = ZEXT3264(auVar22);
    auVar22 = vpbroadcastd_avx512vl(ZEXT416(0xfffffff8));
    auVar45 = ZEXT3264(auVar22);
    local_2480 = ray;
    local_2478 = context;
    local_2470 = uVar13;
    do {
      pfVar1 = (float *)(local_2468 + -1);
      local_2468 = local_2468 + -2;
      if (*pfVar1 <= auVar32._0_4_) {
        uVar14 = *local_2468;
        while ((uVar14 & 8) == 0) {
          pauVar9 = (undefined1 (*) [32])(uVar14 & 0xfffffffffffffff0);
          uVar34 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 0xc);
          auVar25._4_4_ = uVar34;
          auVar25._0_4_ = uVar34;
          auVar25._8_4_ = uVar34;
          auVar25._12_4_ = uVar34;
          auVar25._16_4_ = uVar34;
          auVar25._20_4_ = uVar34;
          auVar25._24_4_ = uVar34;
          auVar25._28_4_ = uVar34;
          auVar4 = vfmadd213ps_fma(*(undefined1 (*) [32])(pauVar9[8] + uVar13),auVar25,
                                   *(undefined1 (*) [32])(pauVar9[2] + uVar13));
          auVar4 = vfmadd213ps_fma(ZEXT1632(auVar4),auVar37._0_32_,auVar41._0_32_);
          auVar22 = vmaxps_avx(auVar40._0_32_,ZEXT1632(auVar4));
          auVar4 = vfmadd213ps_fma(*(undefined1 (*) [32])(pauVar9[8] + uVar16),auVar25,
                                   *(undefined1 (*) [32])(pauVar9[2] + uVar16));
          auVar18 = vfmadd213ps_fma(*(undefined1 (*) [32])(pauVar9[8] + uVar15),auVar25,
                                    *(undefined1 (*) [32])(pauVar9[2] + uVar15));
          auVar4 = vfmadd213ps_fma(ZEXT1632(auVar4),auVar38._0_32_,auVar42._0_32_);
          auVar23 = vfmadd213ps_avx512vl(ZEXT1632(auVar18),auVar39._0_32_,auVar43._0_32_);
          auVar23 = vmaxps_avx(ZEXT1632(auVar4),auVar23);
          auVar22 = vmaxps_avx(auVar22,auVar23);
          auVar4 = vfmadd213ps_fma(*(undefined1 (*) [32])(pauVar9[8] + uVar12),auVar25,
                                   *(undefined1 (*) [32])(pauVar9[2] + uVar12));
          auVar18 = vfmadd213ps_fma(*(undefined1 (*) [32])(pauVar9[8] + (uVar16 ^ 0x20)),auVar25,
                                    *(undefined1 (*) [32])(pauVar9[2] + (uVar16 ^ 0x20)));
          auVar4 = vfmadd213ps_fma(ZEXT1632(auVar4),auVar37._0_32_,auVar41._0_32_);
          auVar18 = vfmadd213ps_fma(ZEXT1632(auVar18),auVar38._0_32_,auVar42._0_32_);
          auVar21 = vfmadd213ps_fma(*(undefined1 (*) [32])(pauVar9[8] + (uVar15 ^ 0x20)),auVar25,
                                    *(undefined1 (*) [32])(pauVar9[2] + (uVar15 ^ 0x20)));
          auVar23 = vfmadd213ps_avx512vl(ZEXT1632(auVar21),auVar39._0_32_,auVar43._0_32_);
          auVar23 = vminps_avx(ZEXT1632(auVar18),auVar23);
          auVar33 = vminps_avx(auVar31._0_32_,ZEXT1632(auVar4));
          auVar23 = vminps_avx(auVar33,auVar23);
          uVar17 = vcmpps_avx512vl(auVar22,auVar23,2);
          if (((uint)uVar14 & 7) == 6) {
            uVar14 = vcmpps_avx512vl(auVar25,pauVar9[0xe],0xd);
            uVar6 = vcmpps_avx512vl(auVar25,pauVar9[0xf],1);
            uVar17 = uVar17 & uVar14 & uVar6;
          }
          bVar8 = (byte)uVar17;
          if (bVar8 == 0) {
            auVar4 = vmovshdup_avx(SUB3216(*(undefined1 (*) [32])
                                            ((long)&(ray->super_RayK<1>).dir.field_0 + 0xc),0));
            auVar32 = ZEXT1664(auVar4);
            goto LAB_01f34de9;
          }
          auVar23 = *pauVar9;
          auVar33 = pauVar9[1];
          auVar24 = vmovdqa64_avx512vl(auVar44._0_32_);
          auVar24 = vpternlogd_avx512vl(auVar24,auVar22,auVar45._0_32_,0xf8);
          auVar25 = vpcompressd_avx512vl(auVar24);
          auVar27._0_4_ =
               (uint)(bVar8 & 1) * auVar25._0_4_ | (uint)!(bool)(bVar8 & 1) * auVar24._0_4_;
          bVar3 = (bool)((byte)(uVar17 >> 1) & 1);
          auVar27._4_4_ = (uint)bVar3 * auVar25._4_4_ | (uint)!bVar3 * auVar24._4_4_;
          bVar3 = (bool)((byte)(uVar17 >> 2) & 1);
          auVar27._8_4_ = (uint)bVar3 * auVar25._8_4_ | (uint)!bVar3 * auVar24._8_4_;
          bVar3 = (bool)((byte)(uVar17 >> 3) & 1);
          auVar27._12_4_ = (uint)bVar3 * auVar25._12_4_ | (uint)!bVar3 * auVar24._12_4_;
          bVar3 = (bool)((byte)(uVar17 >> 4) & 1);
          auVar27._16_4_ = (uint)bVar3 * auVar25._16_4_ | (uint)!bVar3 * auVar24._16_4_;
          bVar3 = (bool)((byte)(uVar17 >> 5) & 1);
          auVar27._20_4_ = (uint)bVar3 * auVar25._20_4_ | (uint)!bVar3 * auVar24._20_4_;
          bVar3 = (bool)((byte)(uVar17 >> 6) & 1);
          auVar27._24_4_ = (uint)bVar3 * auVar25._24_4_ | (uint)!bVar3 * auVar24._24_4_;
          bVar3 = SUB81(uVar17 >> 7,0);
          auVar27._28_4_ = (uint)bVar3 * auVar25._28_4_ | (uint)!bVar3 * auVar24._28_4_;
          auVar24 = vpermt2q_avx512vl(auVar23,auVar27,auVar33);
          uVar14 = auVar24._0_8_;
          bVar8 = bVar8 - 1 & bVar8;
          if (bVar8 != 0) {
            auVar24 = vpshufd_avx2(auVar27,0x55);
            vpermt2q_avx512vl(auVar23,auVar24,auVar33);
            auVar25 = vpminsd_avx2(auVar27,auVar24);
            auVar24 = vpmaxsd_avx2(auVar27,auVar24);
            bVar8 = bVar8 - 1 & bVar8;
            if (bVar8 == 0) {
              auVar25 = vpermi2q_avx512vl(auVar25,auVar23,auVar33);
              uVar14 = auVar25._0_8_;
              auVar23 = vpermt2q_avx512vl(auVar23,auVar24,auVar33);
              *local_2468 = auVar23._0_8_;
              auVar22 = vpermd_avx2(auVar24,auVar22);
              *(int *)(local_2468 + 1) = auVar22._0_4_;
              local_2468 = local_2468 + 2;
            }
            else {
              auVar36 = vpshufd_avx2(auVar27,0xaa);
              vpermt2q_avx512vl(auVar23,auVar36,auVar33);
              auVar28 = vpminsd_avx2(auVar25,auVar36);
              auVar25 = vpmaxsd_avx2(auVar25,auVar36);
              auVar36 = vpminsd_avx2(auVar24,auVar25);
              auVar24 = vpmaxsd_avx2(auVar24,auVar25);
              bVar8 = bVar8 - 1 & bVar8;
              if (bVar8 == 0) {
                auVar25 = vpermi2q_avx512vl(auVar28,auVar23,auVar33);
                uVar14 = auVar25._0_8_;
                auVar25 = vpermt2q_avx512vl(auVar23,auVar24,auVar33);
                *local_2468 = auVar25._0_8_;
                auVar24 = vpermd_avx2(auVar24,auVar22);
                *(int *)(local_2468 + 1) = auVar24._0_4_;
                auVar23 = vpermt2q_avx512vl(auVar23,auVar36,auVar33);
                local_2468[2] = auVar23._0_8_;
                auVar22 = vpermd_avx2(auVar36,auVar22);
                *(int *)(local_2468 + 3) = auVar22._0_4_;
                local_2468 = local_2468 + 4;
              }
              else {
                auVar25 = vpshufd_avx2(auVar27,0xff);
                vpermt2q_avx512vl(auVar23,auVar25,auVar33);
                auVar5 = vpminsd_avx2(auVar28,auVar25);
                auVar25 = vpmaxsd_avx2(auVar28,auVar25);
                auVar28 = vpminsd_avx2(auVar36,auVar25);
                auVar25 = vpmaxsd_avx2(auVar36,auVar25);
                auVar36 = vpminsd_avx2(auVar24,auVar25);
                auVar24 = vpmaxsd_avx2(auVar24,auVar25);
                bVar8 = bVar8 - 1 & bVar8;
                if (bVar8 == 0) {
                  auVar25 = vpermi2q_avx512vl(auVar5,auVar23,auVar33);
                  uVar14 = auVar25._0_8_;
                  auVar25 = vpermt2q_avx512vl(auVar23,auVar24,auVar33);
                  *local_2468 = auVar25._0_8_;
                  auVar24 = vpermd_avx2(auVar24,auVar22);
                  *(int *)(local_2468 + 1) = auVar24._0_4_;
                  auVar24 = vpermt2q_avx512vl(auVar23,auVar36,auVar33);
                  local_2468[2] = auVar24._0_8_;
                  auVar24 = vpermd_avx2(auVar36,auVar22);
                  *(int *)(local_2468 + 3) = auVar24._0_4_;
                  auVar23 = vpermt2q_avx512vl(auVar23,auVar28,auVar33);
                  local_2468[4] = auVar23._0_8_;
                  auVar22 = vpermd_avx2(auVar28,auVar22);
                  *(int *)(local_2468 + 5) = auVar22._0_4_;
                  local_2468 = local_2468 + 6;
                }
                else {
                  auVar26 = valignd_avx512vl(auVar27,auVar27,3);
                  auVar25 = vpmovsxbd_avx512vl(ZEXT816(0x303020108));
                  auVar27 = vpermt2d_avx512vl(ZEXT1632(CONCAT412(0x80000000,
                                                                 CONCAT48(0x80000000,
                                                                          0x8000000080000000))),
                                              auVar25,auVar5);
                  auVar25 = vpmovsxbd_avx2(ZEXT816(0x5040302010008));
                  auVar27 = vpermt2d_avx512vl(auVar27,auVar25,auVar28);
                  auVar27 = vpermt2d_avx512vl(auVar27,auVar25,auVar36);
                  auVar25 = vpmovsxbd_avx2(ZEXT816(0x605040302010008));
                  auVar24 = vpermt2d_avx512vl(auVar27,auVar25,auVar24);
                  auVar32 = ZEXT3264(auVar24);
                  bVar11 = bVar8;
                  do {
                    auVar25 = auVar32._0_32_;
                    auVar36._8_4_ = 1;
                    auVar36._0_8_ = 0x100000001;
                    auVar36._12_4_ = 1;
                    auVar36._16_4_ = 1;
                    auVar36._20_4_ = 1;
                    auVar36._24_4_ = 1;
                    auVar36._28_4_ = 1;
                    auVar24 = vpermd_avx2(auVar36,auVar26);
                    auVar26 = valignd_avx512vl(auVar26,auVar26,1);
                    vpermt2q_avx512vl(auVar23,auVar26,auVar33);
                    bVar11 = bVar11 - 1 & bVar11;
                    uVar35 = vpcmpd_avx512vl(auVar24,auVar25,5);
                    auVar24 = vpmaxsd_avx2(auVar24,auVar25);
                    bVar7 = (byte)uVar35 << 1;
                    auVar25 = valignd_avx512vl(auVar25,auVar25,7);
                    bVar3 = (bool)((byte)uVar35 & 1);
                    auVar28._4_4_ = (uint)bVar3 * auVar25._4_4_ | (uint)!bVar3 * auVar24._4_4_;
                    auVar28._0_4_ = auVar24._0_4_;
                    bVar3 = (bool)(bVar7 >> 2 & 1);
                    auVar28._8_4_ = (uint)bVar3 * auVar25._8_4_ | (uint)!bVar3 * auVar24._8_4_;
                    bVar3 = (bool)(bVar7 >> 3 & 1);
                    auVar28._12_4_ = (uint)bVar3 * auVar25._12_4_ | (uint)!bVar3 * auVar24._12_4_;
                    bVar3 = (bool)(bVar7 >> 4 & 1);
                    auVar28._16_4_ = (uint)bVar3 * auVar25._16_4_ | (uint)!bVar3 * auVar24._16_4_;
                    bVar3 = (bool)(bVar7 >> 5 & 1);
                    auVar28._20_4_ = (uint)bVar3 * auVar25._20_4_ | (uint)!bVar3 * auVar24._20_4_;
                    bVar3 = (bool)(bVar7 >> 6 & 1);
                    auVar28._24_4_ = (uint)bVar3 * auVar25._24_4_ | (uint)!bVar3 * auVar24._24_4_;
                    auVar28._28_4_ =
                         (uint)(bVar7 >> 7) * auVar25._28_4_ |
                         (uint)!(bool)(bVar7 >> 7) * auVar24._28_4_;
                    auVar32 = ZEXT3264(auVar28);
                  } while (bVar11 != 0);
                  lVar10 = (ulong)(uint)POPCOUNT((uint)bVar8) + 3;
                  do {
                    auVar24 = vpermi2q_avx512vl(auVar28,auVar23,auVar33);
                    *local_2468 = auVar24._0_8_;
                    auVar25 = auVar32._0_32_;
                    auVar24 = vpermd_avx2(auVar25,auVar22);
                    *(int *)(local_2468 + 1) = auVar24._0_4_;
                    auVar28 = valignd_avx512vl(auVar25,auVar25,1);
                    local_2468 = local_2468 + 2;
                    auVar32 = ZEXT3264(auVar28);
                    lVar10 = lVar10 + -1;
                  } while (lVar10 != 0);
                  auVar22 = vpermt2q_avx512vl(auVar23,auVar28,auVar33);
                  uVar14 = auVar22._0_8_;
                }
              }
            }
          }
        }
        local_2460 = (ulong)((uint)uVar14 & 0xf) - 8;
        if (local_2460 != 0) {
          prim = (Primitive *)(uVar14 & 0xfffffffffffffff0);
          do {
            InstanceArrayIntersector1MB::intersect(&local_2481,local_2480,local_2478,prim);
            prim = prim + 1;
            local_2460 = local_2460 + -1;
            ray = local_2480;
          } while (local_2460 != 0);
        }
        fVar29 = (ray->super_RayK<1>).tfar;
        auVar31 = ZEXT3264(CONCAT428(fVar29,CONCAT424(fVar29,CONCAT420(fVar29,CONCAT416(fVar29,
                                                  CONCAT412(fVar29,CONCAT48(fVar29,CONCAT44(fVar29,
                                                  fVar29))))))));
        auVar32 = ZEXT464((uint)(ray->super_RayK<1>).tfar);
        auVar37 = ZEXT3264(local_2398);
        auVar38 = ZEXT3264(local_23b8);
        auVar39 = ZEXT3264(local_23d8);
        auVar40 = ZEXT3264(local_23f8);
        auVar41 = ZEXT3264(local_2418);
        auVar42 = ZEXT3264(local_2438);
        auVar43 = ZEXT3264(local_2458);
        auVar22 = vpmovsxbd_avx512vl(ZEXT816(0x706050403020100));
        auVar44 = ZEXT3264(auVar22);
        auVar22 = vpbroadcastd_avx512vl(ZEXT416(0xfffffff8));
        auVar45 = ZEXT3264(auVar22);
        uVar13 = local_2470;
      }
LAB_01f34de9:
    } while (local_2468 != &local_2378);
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }